

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crashcatcher.c
# Opt level: O0

size_t safe_write(int fd,void *buf,size_t len)

{
  ssize_t sVar1;
  int *piVar2;
  ssize_t rem;
  size_t ret;
  size_t len_local;
  void *buf_local;
  int fd_local;
  
  rem = 0;
  do {
    while( true ) {
      if (len <= (ulong)rem) {
        return rem;
      }
      sVar1 = write(fd,(void *)((long)buf + rem),len - rem);
      if (sVar1 == -1) break;
      rem = sVar1 + rem;
    }
    piVar2 = __errno_location();
  } while (*piVar2 == 4);
  return rem;
}

Assistant:

static size_t safe_write(int fd, const void *buf, size_t len)
{
	size_t ret = 0;
	while(ret < len)
	{
		ssize_t rem;
		if((rem=write(fd, (const char*)buf+ret, len-ret)) == -1)
		{
			if(errno == EINTR)
				continue;
			break;
		}
		ret += rem;
	}
	return ret;
}